

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveMemory.cpp
# Opt level: O2

void __thiscall wasm::RemoveMemory::run(RemoveMemory *this,Module *module)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(wasm::DataSegment_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveMemory.cpp:28:32)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(wasm::DataSegment_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveMemory.cpp:28:32)>
             ::_M_manager;
  Module::removeDataSegments(module,(function<bool_(wasm::DataSegment_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void run(Module* module) override {
    module->removeDataSegments([&](DataSegment* curr) { return true; });
  }